

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateSetTimeRequestReturnCallback
               (HelicsFederate fed,_func_void_HelicsTime_HelicsBool_void_ptr *requestTimeReturn,
               void *userdata,HelicsError *err)

{
  Federate *this;
  _Any_data *this_00;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = &local_68;
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (requestTimeReturn == (_func_void_HelicsTime_HelicsBool_void_ptr *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      helics::Federate::setTimeRequestReturnCallback
                (this,(function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)&local_68);
    }
    else {
      local_28 = std::
                 _Function_handler<void_(TimeRepresentation<count_time<9,_long>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1396:50)>
                 ::_M_invoke;
      local_30 = std::
                 _Function_handler<void_(TimeRepresentation<count_time<9,_long>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1396:50)>
                 ::_M_manager;
      local_40._M_unused._0_8_ = (undefined8)requestTimeReturn;
      local_40._8_8_ = userdata;
      helics::Federate::setTimeRequestReturnCallback
                (this,(function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)&local_40);
      this_00 = &local_40;
    }
    std::_Function_base::~_Function_base((_Function_base *)this_00);
  }
  return;
}

Assistant:

void helicsFederateSetTimeRequestReturnCallback(HelicsFederate fed,
                                                void (*requestTimeReturn)(HelicsTime newTime, HelicsBool iterating, void* userdata),
                                                void* userdata,
                                                HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (requestTimeReturn == nullptr) {
            fedptr->setTimeRequestReturnCallback({});
        } else {
            fedptr->setTimeRequestReturnCallback([requestTimeReturn, userdata](helics::Time newTime, bool iterating) {
                requestTimeReturn(newTime, (iterating) ? HELICS_TRUE : HELICS_FALSE, userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}